

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack29_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x1fffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x1d;
  out[1] = (uVar1 >> 0x1d) + base + (in[1] & 0x3ffffff) * 8;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x1a;
  out[2] = (uVar1 >> 0x1a) + base + (in[2] & 0x7fffff) * 0x40;
  uVar1 = in[2];
  out[3] = uVar1 >> 0x17;
  out[3] = (uVar1 >> 0x17) + base + (in[3] & 0xfffff) * 0x200;
  uVar1 = in[3];
  out[4] = uVar1 >> 0x14;
  out[4] = (uVar1 >> 0x14) + base + (in[4] & 0x1ffff) * 0x1000;
  uVar1 = in[4];
  out[5] = uVar1 >> 0x11;
  out[5] = (uVar1 >> 0x11) + base + (in[5] & 0x3fff) * 0x8000;
  uVar1 = in[5];
  out[6] = uVar1 >> 0xe;
  out[6] = (uVar1 >> 0xe) + base + (in[6] & 0x7ff) * 0x40000;
  uVar1 = in[6];
  out[7] = uVar1 >> 0xb;
  out[7] = (uVar1 >> 0xb) + base + (in[7] & 0xff) * 0x200000;
  return in + 8;
}

Assistant:

uint32_t * unpack29_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 29 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 29 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 23 ))<<( 29 - 23 );
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 29 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 17 ))<<( 29 - 17 );
    *out += base;
    out++;
    *out = ( (*in) >>  17  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 29 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 11 ))<<( 29 - 11 );
    *out += base;
    out++;
    *out = ( (*in) >>  11  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 29 - 8 );
    *out += base;
    out++;

    return in + 1;
}